

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

QString * QTest::Internal::formatTryTimeoutDebugMessage(QUtf8StringView expr,int timeout,int actual)

{
  QLatin1StringView str;
  QBasicUtf8StringView<false> v;
  QAnyStringView s;
  QAnyStringView s_00;
  QAnyStringView s_01;
  int in_ECX;
  QString *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  ArgBase *argBases [4];
  size_t in_stack_fffffffffffffe20;
  QAnyStringView *in_stack_fffffffffffffe28;
  QString *str_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffe30;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  char *in_stack_fffffffffffffe38;
  undefined1 *puVar1;
  undefined1 local_148 [24];
  undefined1 local_130 [24];
  QLatin1StringView local_118;
  undefined1 local_e8 [40];
  undefined1 local_c0 [64];
  QString local_80;
  qsizetype local_68;
  char *pcStack_60;
  ulong local_58;
  ArgBase **local_50;
  ulong local_48;
  ArgBase **ppAStack_40;
  ulong local_38;
  ArgBase **ppAStack_30;
  QString *local_28;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_20;
  undefined1 *local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_118 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  QString::number((int)local_130,in_ECX);
  QString::number((int)local_148,in_R8D);
  local_68 = local_118.m_size;
  pcStack_60 = local_118.m_data;
  str.m_data = in_stack_fffffffffffffe38;
  str.m_size = (qsizetype)in_stack_fffffffffffffe30.m_data;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe28,str);
  v.m_size = (qsizetype)in_stack_fffffffffffffe38;
  v.m_data = (storage_type *)in_stack_fffffffffffffe30.m_data;
  QAnyStringView::QAnyStringView<false>(in_stack_fffffffffffffe28,v);
  str_00 = &local_80;
  s.m_size = (size_t)in_stack_fffffffffffffe38;
  s.field_0.m_data = in_stack_fffffffffffffe30.m_data;
  QtPrivate::qStringLikeToArg(s);
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffe30.m_data,str_00);
  this.m_data = local_c0;
  s_00.m_size = (size_t)in_stack_fffffffffffffe38;
  s_00.field_0.m_data = this.m_data;
  QtPrivate::qStringLikeToArg(s_00);
  QAnyStringView::QAnyStringView((QAnyStringView *)this.m_data,str_00);
  puVar1 = local_e8;
  s_01.m_size = (size_t)puVar1;
  s_01.field_0.m_data = this.m_data;
  QtPrivate::qStringLikeToArg(s_01);
  local_38 = local_58;
  ppAStack_30 = local_50;
  uStack_10 = 0;
  local_48 = local_58;
  ppAStack_40 = local_50;
  local_28 = str_00;
  aStack_20 = this;
  local_18 = puVar1;
  QtPrivate::argToQString((QAnyStringView *)in_RDI,local_58,local_50);
  QString::~QString((QString *)0x14ad5e);
  QString::~QString((QString *)0x14ad6b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString Internal::formatTryTimeoutDebugMessage(q_no_char8_t::QUtf8StringView expr, int timeout, int actual)
{
    return "QTestLib: This test case check (\"%1\") failed because the requested timeout (%2 ms) "
           "was too short, %3 ms would have been sufficient this time."_L1
            .arg(expr, QString::number(timeout), QString::number(actual));
}